

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O0

void write_register(YMF271Chip *chip,int slotnum,int reg,UINT8 data)

{
  YMF271Slot *slot_00;
  YMF271Slot *slot;
  UINT8 data_local;
  int reg_local;
  int slotnum_local;
  YMF271Chip *chip_local;
  
  slot_00 = chip->slots + slotnum;
  switch(reg) {
  case 0:
    slot_00->ext_en = (data & 0x80) != 0;
    slot_00->ext_out = (byte)((int)(uint)data >> 3) & 0xf;
    if ((data & 1) == 0) {
      if (slot_00->active != '\0') {
        slot_00->env_state = 3;
      }
    }
    else {
      slot_00->step = 0;
      slot_00->stepptr = 0;
      slot_00->active = '\x01';
      calculate_step(slot_00);
      calculate_status_end(chip,slotnum,'\0');
      init_envelope(chip,slot_00);
      init_lfo(chip,slot_00);
      slot_00->feedback_modulation0 = 0;
      slot_00->feedback_modulation1 = 0;
    }
    break;
  case 1:
    slot_00->lfoFreq = data;
    break;
  case 2:
    slot_00->lfowave = data & 3;
    slot_00->pms = (byte)((int)(uint)data >> 3) & 7;
    slot_00->ams = (UINT8)((int)(uint)data >> 6);
    break;
  case 3:
    slot_00->multiple = data & 0xf;
    slot_00->detune = (byte)((int)(uint)data >> 4) & 7;
    break;
  case 4:
    slot_00->tl = data & 0x7f;
    break;
  case 5:
    slot_00->ar = data & 0x1f;
    slot_00->keyscale = (UINT8)((int)(uint)data >> 5);
    break;
  case 6:
    slot_00->decay1rate = data & 0x1f;
    break;
  case 7:
    slot_00->decay2rate = data & 0x1f;
    break;
  case 8:
    slot_00->relrate = data & 0xf;
    slot_00->decay1lvl = (UINT8)((int)(uint)data >> 4);
    break;
  case 9:
    slot_00->fns = (slot_00->fns_hi & 0xf) << 8 | (uint)data;
    slot_00->block = (UINT8)((int)(uint)slot_00->fns_hi >> 4);
    break;
  case 10:
    slot_00->fns_hi = data;
    break;
  case 0xb:
    slot_00->waveform = data & 7;
    slot_00->feedback = (byte)((int)(uint)data >> 4) & 7;
    slot_00->accon = (data & 0x80) != 0;
    break;
  case 0xc:
    slot_00->algorithm = data & 0xf;
    break;
  case 0xd:
    slot_00->ch0_level = (UINT8)((int)(uint)data >> 4);
    slot_00->ch1_level = data & 0xf;
    break;
  case 0xe:
    slot_00->ch2_level = (UINT8)((int)(uint)data >> 4);
    slot_00->ch3_level = data & 0xf;
  }
  return;
}

Assistant:

static void write_register(YMF271Chip *chip, int slotnum, int reg, UINT8 data)
{
	YMF271Slot *slot = &chip->slots[slotnum];

	switch (reg)
	{
		case 0x0:
			slot->ext_en = (data & 0x80) ? 1 : 0;
			slot->ext_out = (data>>3)&0xf;

			if (data & 1)
			{
				// key on
				slot->step = 0;
				slot->stepptr = 0;

				slot->active = 1;

				calculate_step(slot);
				calculate_status_end(chip,slotnum,0);
				init_envelope(chip, slot);
				init_lfo(chip, slot);
				slot->feedback_modulation0 = 0;
				slot->feedback_modulation1 = 0;
			}
			else
			{
				if (slot->active)
				{
					slot->env_state = ENV_RELEASE;
				}
			}
			break;

		case 0x1:
			slot->lfoFreq = data;
			break;

		case 0x2:
			slot->lfowave = data & 3;
			slot->pms = (data >> 3) & 0x7;
			slot->ams = (data >> 6) & 0x3;
			break;

		case 0x3:
			slot->multiple = data & 0xf;
			slot->detune = (data >> 4) & 0x7;
			break;

		case 0x4:
			slot->tl = data & 0x7f;
			break;

		case 0x5:
			slot->ar = data & 0x1f;
			slot->keyscale = (data >> 5) & 0x7;
			break;

		case 0x6:
			slot->decay1rate = data & 0x1f;
			break;

		case 0x7:
			slot->decay2rate = data & 0x1f;
			break;

		case 0x8:
			slot->relrate = data & 0xf;
			slot->decay1lvl = (data >> 4) & 0xf;
			break;

		case 0x9:
			// write frequency and block here
			slot->fns = (slot->fns_hi << 8 & 0x0f00) | data;
			slot->block = slot->fns_hi >> 4 & 0xf;
			break;

		case 0xa:
			slot->fns_hi = data;
			break;

		case 0xb:
			slot->waveform = data & 0x7;
			slot->feedback = (data >> 4) & 0x7;
			slot->accon = (data & 0x80) ? 1 : 0;
			break;

		case 0xc:
			slot->algorithm = data & 0xf;
			break;

		case 0xd:
			slot->ch0_level = data >> 4;
			slot->ch1_level = data & 0xf;
			break;

		case 0xe:
			slot->ch2_level = data >> 4;
			slot->ch3_level = data & 0xf;
			break;

		default:
			break;
	}
}